

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::clear(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *this)

{
  size_type new_num_buckets;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)this,0,0);
  if ((this->num_elements == 0) && (new_num_buckets == this->num_buckets)) {
    return;
  }
  clear_to_size(this,new_num_buckets);
  return;
}

Assistant:

void clear() {
    // If the table is already empty, and the number of buckets is
    // already as we desire, there's nothing to do.
    const size_type new_num_buckets = settings.min_buckets(0, 0);
    if (num_elements == 0 && new_num_buckets == num_buckets) {
      return;
    }
    clear_to_size(new_num_buckets);
  }